

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O2

void idx2::WriteChunk(idx2_file *Idx2,encode_data *E,channel *C,i8 Level,i8 Subband,i16 BitPlane)

{
  array<unsigned_long> *Src;
  bitstream *Bs;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  byte *pbVar8;
  ulong *puVar9;
  bool bVar10;
  array<unsigned_long> *Array;
  uint uVar11;
  byte *pbVar12;
  FILE *__s;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  u64 uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  undefined8 in_XMM0_Qa;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  stref sVar26;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:272:3)>
  __ScopeGuard__272;
  FILE *Fp;
  iterator ChunkMetaIt;
  file_id FileId;
  chunk_meta_info Cm;
  
  pbVar16 = (C->BrickDeltasStream).BitPtr +
            ((long)(((C->BrickDeltasStream).BitPos + 7) / 8) -
            (long)(C->BrickDeltasStream).Stream.Data);
  auVar23._0_8_ = (double)(long)pbVar16;
  auVar23._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _ZN4idx2L15BrickDeltasStatE_0;
  auVar1 = vminsd_avx(auVar23,auVar1);
  _ZN4idx2L15BrickDeltasStatE_0 = auVar1._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _ZN4idx2L15BrickDeltasStatE_1;
  auVar1 = vmaxsd_avx(auVar23,auVar2);
  _ZN4idx2L15BrickDeltasStatE_1 = auVar1._0_8_;
  _ZN4idx2L15BrickDeltasStatE_2 = auVar23._0_8_ + _ZN4idx2L15BrickDeltasStatE_2;
  _ZN4idx2L15BrickDeltasStatE_3 = _ZN4idx2L15BrickDeltasStatE_3 + 1;
  _ZN4idx2L15BrickDeltasStatE_4 = auVar23._0_8_ * auVar23._0_8_ + _ZN4idx2L15BrickDeltasStatE_4;
  pbVar18 = (C->BrickSizeStream).BitPtr +
            ((long)(((C->BrickSizeStream).BitPos + 7) / 8) - (long)(C->BrickSizeStream).Stream.Data)
  ;
  auVar24._0_8_ = (double)(long)pbVar18;
  auVar24._8_8_ = in_XMM2_Qa;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = _ZN4idx2L14BrickSizesStatE_0;
  auVar1 = vminsd_avx(auVar24,auVar3);
  _ZN4idx2L14BrickSizesStatE_0 = auVar1._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = _ZN4idx2L14BrickSizesStatE_1;
  auVar1 = vmaxsd_avx(auVar24,auVar4);
  _ZN4idx2L14BrickSizesStatE_2 = auVar24._0_8_ + _ZN4idx2L14BrickSizesStatE_2;
  _ZN4idx2L14BrickSizesStatE_1 = auVar1._0_8_;
  _ZN4idx2L14BrickSizesStatE_3 = _ZN4idx2L14BrickSizesStatE_3 + 1;
  _ZN4idx2L14BrickSizesStatE_4 = auVar24._0_8_ * auVar24._0_8_ + _ZN4idx2L14BrickSizesStatE_4;
  iVar7 = (C->BrickStream).BitPos;
  pbVar12 = (C->BrickStream).BitPtr;
  lVar17 = (E->ChunkStream).Stream.Bytes;
  pbVar8 = (C->BrickStream).Stream.Data;
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  Bs = &E->ChunkStream;
  for (lVar22 = lVar17;
      lVar22 <= (long)(pbVar12 +
                      (long)(pbVar18 + (long)pbVar16 +
                            ((long)((iVar7 + 7) / 8) - (long)pbVar8) + 0x48));
      lVar22 = (lVar22 * 3) / 2 + 8) {
  }
  if ((lVar17 < lVar22) && (lVar17 < lVar22 + 8)) {
    Mallocator();
    Cm.Addrs.Buffer.Data = (byte *)0x0;
    Cm.Addrs.Buffer.Bytes = 0;
    Cm.Addrs.Buffer.Alloc = &Mallocator::Instance.super_allocator;
    AllocBuf((buffer *)&Cm,lVar22 + 8,(E->ChunkStream).Stream.Alloc);
    MemCopy(&Bs->Stream,(buffer *)&Cm,
            (u64)((E->ChunkStream).BitPtr +
                 ((long)(((E->ChunkStream).BitPos + 7) / 8) - (long)(E->ChunkStream).Stream.Data)));
    (E->ChunkStream).BitPtr =
         Cm.Addrs.Buffer.Data + ((long)(E->ChunkStream).BitPtr - (long)(E->ChunkStream).Stream.Data)
    ;
    DeallocBuf(&Bs->Stream);
    (E->ChunkStream).Stream.Alloc = Cm.Addrs.Buffer.Alloc;
    (Bs->Stream).Data = Cm.Addrs.Buffer.Data;
    (E->ChunkStream).Stream.Bytes = Cm.Addrs.Buffer.Bytes;
    uVar11 = (E->ChunkStream).BitPos;
    uVar19 = (E->ChunkStream).BitBuf;
  }
  else {
    uVar19 = 0;
    uVar11 = 0;
  }
  uVar20 = (long)C->NBricks;
  do {
    if (0x38 < (int)uVar11) {
      puVar9 = (ulong *)(E->ChunkStream).BitPtr;
      *puVar9 = uVar19;
      uVar19 = (uVar19 >> 1) >> (((byte)uVar11 & 0xf8) - 1 & 0x3f);
      (E->ChunkStream).BitBuf = uVar19;
      (E->ChunkStream).BitPtr = (byte *)((ulong)(uVar11 >> 3) + (long)puVar9);
      uVar11 = uVar11 & 7;
    }
    uVar21 = (ulong)((uint)uVar20 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar11 & 0x3f) |
             uVar19;
    (E->ChunkStream).BitBuf = uVar21;
    uVar15 = uVar11 + 7;
    if (0x37 < (int)uVar11) {
      puVar9 = (ulong *)(E->ChunkStream).BitPtr;
      *puVar9 = uVar21;
      uVar21 = ((E->ChunkStream).BitBuf >> 1) >> (((byte)uVar15 & 0xf8) - 1 & 0x3f);
      (E->ChunkStream).BitBuf = uVar21;
      (E->ChunkStream).BitPtr = (byte *)((ulong)(uVar15 >> 3) + (long)puVar9);
      uVar15 = 7;
    }
    uVar19 = (ulong)(0x7f < uVar20 & (uint)bitstream::Masks.Arr[1]) << ((byte)uVar15 & 0x3f) |
             uVar21;
    uVar11 = uVar15 + 1;
    (E->ChunkStream).BitBuf = uVar19;
    bVar10 = 0x7f < uVar20;
    uVar20 = uVar20 >> 7;
  } while (bVar10);
  (E->ChunkStream).BitPos = uVar11;
  WriteStream(Bs,&C->BrickDeltasStream);
  WriteStream(Bs,&C->BrickSizeStream);
  WriteStream(Bs,&C->BrickStream);
  puVar9 = (ulong *)(E->ChunkStream).BitPtr;
  uVar20 = (E->ChunkStream).BitBuf;
  *puVar9 = uVar20;
  uVar11 = (E->ChunkStream).BitPos;
  if (0 < (int)uVar11 >> 3) {
    (E->ChunkStream).BitBuf = (uVar20 >> 1) >> (((byte)uVar11 & 0xf8) - 1 & 0x3f);
  }
  pbVar12 = (byte *)((long)puVar9 + (long)((int)uVar11 >> 3));
  (E->ChunkStream).BitPtr = pbVar12;
  (E->ChunkStream).BitPos = uVar11 & 7;
  auVar25._0_8_ =
       (double)(long)(pbVar12 + ((ulong)((uVar11 & 7) != 0) - (long)(E->ChunkStream).Stream.Data));
  auVar25._8_8_ = in_XMM3_Qa;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_0;
  auVar2 = vminsd_avx(auVar25,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar25,auVar6);
  _ZN4idx2L18BitPlaneChunksStatE_2 = auVar25._0_8_ + _ZN4idx2L18BitPlaneChunksStatE_2;
  _ZN4idx2L18BitPlaneChunksStatE_0 = auVar2._0_8_;
  _ZN4idx2L18BitPlaneChunksStatE_3 = _ZN4idx2L18BitPlaneChunksStatE_3 + 1;
  _ZN4idx2L18BitPlaneChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L18BitPlaneChunksStatE_4 =
       auVar25._0_8_ * auVar25._0_8_ + _ZN4idx2L18BitPlaneChunksStatE_4;
  pbVar12 = (C->BrickSizeStream).Stream.Data;
  (C->BrickDeltasStream).BitPtr = (C->BrickDeltasStream).Stream.Data;
  (C->BrickDeltasStream).BitPos = 0;
  (C->BrickDeltasStream).BitBuf = 0;
  (C->BrickSizeStream).BitPtr = pbVar12;
  (C->BrickSizeStream).BitPos = 0;
  (C->BrickSizeStream).BitBuf = 0;
  (C->BrickStream).BitPtr = (C->BrickStream).Stream.Data;
  (C->BrickStream).BitPos = 0;
  (C->BrickStream).BitBuf = 0;
  ConstructFilePath(&FileId,Idx2,C->LastBrick,Level,Subband,BitPlane);
  __s = fopen(FileId.Name.field_0.Ptr,"ab");
  __ScopeGuard__272.Func.Fp = &Fp;
  __ScopeGuard__272.Dismissed = false;
  if (__s == (FILE *)0x0) {
    ChunkMetaIt.Key = (unsigned_long *)FileId.Name.field_0.Ptr;
    Fp = (FILE *)__s;
    sVar13 = strlen(FileId.Name.field_0.Ptr);
    ChunkMetaIt.Val._0_4_ = (undefined4)sVar13;
    sVar26 = GetParentPath((stref *)&ChunkMetaIt);
    Cm.Addrs.Buffer.Data = (byte *)sVar26.field_0;
    Cm.Addrs.Buffer.Bytes = CONCAT44(Cm.Addrs.Buffer.Bytes._4_4_,sVar26.Size);
    CreateFullDir((stref *)&Cm);
    __s = fopen(FileId.Name.field_0.Ptr,"ab");
  }
  pbVar12 = (E->ChunkStream).Stream.Data;
  Fp = (FILE *)__s;
  fwrite(pbVar12,(size_t)((E->ChunkStream).BitPtr +
                         ((long)(((E->ChunkStream).BitPos + 7) / 8) - (long)pbVar12)),1,__s);
  Lookup<unsigned_long,idx2::chunk_meta_info>
            (&ChunkMetaIt,(idx2 *)&E->ChunkMeta,
             (hash_table<unsigned_long,_idx2::chunk_meta_info> *)&FileId.Id,(unsigned_long *)__s);
  if ((ChunkMetaIt.Ht)->Stats[ChunkMetaIt.Idx] != Occupied) {
    chunk_meta_info::chunk_meta_info(&Cm);
    Mallocator();
    (**(code **)Mallocator::Instance.super_allocator._vptr_allocator)
              (&Mallocator::Instance,&Cm.Sizes,0x88);
    Cm.Sizes.BitPtr = Cm.Sizes.Stream.Data;
    Cm.Sizes.BitPos = 0;
    Cm.Sizes.BitBuf = 0;
    Insert<unsigned_long,idx2::chunk_meta_info>(&ChunkMetaIt,&FileId.Id,&Cm);
  }
  Array = (array<unsigned_long> *)CONCAT44(ChunkMetaIt.Val._4_4_,ChunkMetaIt.Val._0_4_);
  Src = Array + 1;
  uVar11 = *(uint *)&Array[1].Alloc;
  lVar17 = Array[1].Buffer.Bytes;
  for (lVar22 = lVar17;
      lVar22 <= (Array[1].Size - (long)Array[1].Buffer.Data) + (long)((int)(uVar11 + 7) / 8) + 0xc;
      lVar22 = (lVar22 * 3) / 2 + 8) {
  }
  if ((lVar17 < lVar22) && (lVar17 < lVar22 + 8)) {
    Mallocator();
    Cm.Addrs.Buffer.Data = (byte *)0x0;
    Cm.Addrs.Buffer.Bytes = 0;
    Cm.Addrs.Buffer.Alloc = &Mallocator::Instance.super_allocator;
    AllocBuf((buffer *)&Cm,lVar22 + 8,Array[1].Buffer.Alloc);
    MemCopy(&Src->Buffer,(buffer *)&Cm,
            (long)((*(int *)&Array[1].Alloc + 7) / 8) + (Array[1].Size - (long)Array[1].Buffer.Data)
           );
    Array[1].Size = (i64)(Cm.Addrs.Buffer.Data + (Array[1].Size - (long)Array[1].Buffer.Data));
    DeallocBuf(&Src->Buffer);
    Array[1].Buffer.Alloc = Cm.Addrs.Buffer.Alloc;
    (Src->Buffer).Data = Cm.Addrs.Buffer.Data;
    Array[1].Buffer.Bytes = Cm.Addrs.Buffer.Bytes;
    uVar11 = *(uint *)&Array[1].Alloc;
  }
  uVar20 = Array[1].Capacity;
  pbVar12 = (E->ChunkStream).BitPtr +
            ((long)(((E->ChunkStream).BitPos + 7) / 8) - (long)(E->ChunkStream).Stream.Data);
  do {
    if (0x38 < (int)uVar11) {
      puVar9 = (ulong *)Array[1].Size;
      *puVar9 = uVar20;
      uVar20 = (uVar20 >> 1) >> (((byte)uVar11 & 0xf8) - 1 & 0x3f);
      Array[1].Capacity = uVar20;
      Array[1].Size = (ulong)(uVar11 >> 3) + (long)puVar9;
      uVar11 = uVar11 & 7;
    }
    uVar20 = (ulong)((uint)pbVar12 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar11 & 0x3f)
             | uVar20;
    Array[1].Capacity = uVar20;
    uVar15 = uVar11 + 7;
    if (0x37 < (int)uVar11) {
      puVar9 = (ulong *)Array[1].Size;
      *puVar9 = uVar20;
      uVar20 = ((ulong)Array[1].Capacity >> 1) >> (((byte)uVar15 & 0xf8) - 1 & 0x3f);
      Array[1].Capacity = uVar20;
      Array[1].Size = (ulong)(uVar15 >> 3) + (long)puVar9;
      uVar15 = 7;
    }
    uVar20 = (ulong)((byte *)0x7f < pbVar12 & (uint)bitstream::Masks.Arr[1]) <<
             ((byte)uVar15 & 0x3f) | uVar20;
    uVar11 = uVar15 + 1;
    Array[1].Capacity = uVar20;
    bVar10 = (byte *)0x7f < pbVar12;
    pbVar12 = (byte *)((ulong)pbVar12 >> 7);
  } while (bVar10);
  *(uint *)&Array[1].Alloc = uVar11;
  if (Level < '\x10') {
    uVar20 = C->LastBrick;
    iVar7 = (Idx2->BricksPerChunk).Arr[Level];
    uVar21 = (ulong)iVar7;
    lVar17 = Array->Size;
    if (Array->Capacity <= lVar17) {
      GrowCapacity<unsigned_long>(Array,0);
      lVar17 = Array->Size;
    }
    lVar22 = 0x3f;
    if (uVar21 != 0) {
      for (; uVar21 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    bVar14 = -(iVar7 == 0) | (byte)lVar22;
    Array->Size = lVar17 + 1;
    *(ulong *)((Array->Buffer).Data + lVar17 * 8) =
         ((ulong)((ushort)BitPlane & 0xfff) |
         (long)((int)Subband << 0xc) + ((ulong)(byte)Level << 0x3c)) +
         (uVar20 >> ((1L << (bVar14 & 0x3f) != uVar21) + bVar14 & 0x3f)) * 0x40000;
    (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
    (E->ChunkStream).BitPos = 0;
    (E->ChunkStream).BitBuf = 0;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:272:3)>
    ::~scope_guard(&__ScopeGuard__272);
    return;
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
}

Assistant:

void
WriteChunk(const idx2_file& Idx2, encode_data* E, channel* C, i8 Level, i8 Subband, i16 BitPlane)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
    BrickSizesStat.Add((f64)Size(C->BrickSizeStream));      // brick sizes
    i64 ChunkSize =
      Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
    Rewind(&E->ChunkStream);
    GrowToAccomodate(&E->ChunkStream, ChunkSize);
    WriteVarByte(&E->ChunkStream, C->NBricks);
    WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
    WriteStream(&E->ChunkStream, &C->BrickSizeStream);
    WriteStream(&E->ChunkStream, &C->BrickStream);
    Flush(&E->ChunkStream);
    BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

    /* we are done with these, rewind */
    Rewind(&C->BrickDeltasStream);
    Rewind(&C->BrickSizeStream);
    Rewind(&C->BrickStream);

    u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
    buffer Buf = ToBuffer(E->ChunkStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkAddress))
      idx2_ExitIf(true, "Write chunk failed\n");
    Rewind(&E->ChunkStream);
    return;
  }
#endif

  BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
  BrickSizesStat.Add((f64)Size(C->BrickSizeStream));       // brick sizes
  i64 ChunkSize = Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
  Rewind(&E->ChunkStream);
  GrowToAccomodate(&E->ChunkStream, ChunkSize);
  WriteVarByte(&E->ChunkStream, C->NBricks);
  WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
  WriteStream(&E->ChunkStream, &C->BrickSizeStream);
  WriteStream(&E->ChunkStream, &C->BrickStream);
  Flush(&E->ChunkStream);
  BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

  /* we are done with these, rewind */
  Rewind(&C->BrickDeltasStream);
  Rewind(&C->BrickSizeStream);
  Rewind(&C->BrickStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, C->LastBrick, Level, Subband, BitPlane);
  idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
  WriteBuffer(Fp, ToBuffer(E->ChunkStream));
  /* keep track of the chunk addresses and sizes */
  auto ChunkMetaIt = Lookup(E->ChunkMeta, FileId.Id);
  if (!ChunkMetaIt)
  {
    chunk_meta_info Cm;
    InitWrite(&Cm.Sizes, 128);
    Insert(&ChunkMetaIt, FileId.Id, Cm);
  }
  idx2_Assert(ChunkMetaIt);
  chunk_meta_info* ChunkMeta = ChunkMetaIt.Val;
  GrowToAccomodate(&ChunkMeta->Sizes, 4);
  // Write the size of the chunk stream
  WriteVarByte(&ChunkMeta->Sizes, Size(E->ChunkStream));
  u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
  PushBack(&ChunkMeta->Addrs, ChunkAddress);
  Rewind(&E->ChunkStream);
}